

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

Vector * __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *pEVar1;
  pointer *ppMVar2;
  Vector *pVVar3;
  double *pdVar4;
  pointer pMVar5;
  iterator __position;
  _func_int **__ptr;
  double *pdVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  Index size;
  double *pdVar9;
  long lVar10;
  char *__function;
  Index index;
  Index index_1;
  long lVar11;
  ulong uVar12;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *this_00;
  IMUElasticLocalFrameDynamicalSystem *this_01;
  ulong uVar13;
  uint uVar14;
  ActualDstType actualDst;
  bool bVar15;
  undefined8 extraout_XMM0_Qb;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  timespec time2;
  timespec time1;
  timespec time3;
  double local_e0;
  void *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  double local_b8;
  undefined1 local_a8 [16];
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *local_98;
  undefined1 auStack_90 [16];
  size_t local_80;
  timespec local_78;
  _Elt_pointer local_68;
  undefined1 local_50 [24];
  long local_38;
  
  if (this->on_ != true) {
    pVVar3 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    lVar11 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (lVar11 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar11 != 0) {
      memset((pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar11 << 3);
    }
    pEVar1 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
    uVar8 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)pEVar1);
    ZeroDelayObserver::setState((ZeroDelayObserver *)pEVar1,pVVar3,uVar8);
    uVar8 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)pEVar1);
    if (uVar8 != 0) {
      ZeroDelayObserver::clearMeasurements((ZeroDelayObserver *)pEVar1);
      ZeroDelayObserver::clearInputs((ZeroDelayObserver *)pEVar1);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x3e])(this);
    }
    goto LAB_0014a876;
  }
  clock_gettime(2,&local_78);
  clock_gettime(2,(timespec *)(auStack_90 + 8));
  pEVar1 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  uVar8 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)pEVar1);
  if (uVar8 == 0) {
LAB_0014a483:
    clock_gettime(2,(timespec *)(local_50 + 0x10));
    local_38 = local_38 - local_80;
    lVar11 = local_38 + 1000000000;
    if (-1 < local_38) {
      lVar11 = local_38;
    }
    local_78.tv_nsec = local_80 - local_78.tv_nsec;
    lVar10 = local_78.tv_nsec + 1000000000;
    if (-1 < local_78.tv_nsec) {
      lVar10 = local_78.tv_nsec;
    }
    this->computeFlexibilityTime_ = (double)lVar11 - (double)lVar10;
    if (8 < (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows) {
      pdVar9 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar9[6] = 0.0;
      pdVar9[7] = 0.0;
      pdVar9[8] = 0.0;
      uVar8 = (this->functor_).nbContacts_;
      uVar13 = (ulong)uVar8;
      if (uVar8 != 0) {
        lVar11 = 0x10;
        uVar12 = 0;
        do {
          if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows < 6) goto LAB_0014a899;
          pdVar9 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          local_a8 = *(undefined1 (*) [16])(pdVar9 + 3);
          local_e0 = pdVar9[5];
          dVar16 = local_e0 * local_e0 +
                   local_a8._8_8_ * local_a8._8_8_ + local_a8._0_8_ * local_a8._0_8_;
          if (dVar16 <= 9.999999999999999e-33) {
            local_98 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)0x0;
            auStack_90._0_4_ = 0;
            auStack_90._4_4_ = 0;
            local_a8 = ZEXT816(0);
            local_e0 = 1.0;
          }
          else {
            if (dVar16 < 0.0) {
              local_98 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                          *)sqrt(dVar16);
              auStack_90._0_8_ = extraout_XMM0_Qb;
            }
            else {
              local_98 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                          *)SQRT(dVar16);
              auStack_90._0_4_ = 0;
              auStack_90._4_4_ = 0;
            }
            auVar18._8_8_ = local_98;
            auVar18._0_8_ = local_98;
            local_a8 = divpd(local_a8,auVar18);
            local_e0 = local_e0 / (double)local_98;
          }
          local_68 = (_Elt_pointer)sin((double)local_98);
          dVar16 = cos((double)local_98);
          if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows < 0xc) goto LAB_0014a899;
          dVar20 = 1.0 - dVar16;
          dVar21 = dVar20 * (double)local_a8._0_8_;
          dVar25 = dVar20 * (double)local_a8._8_8_ * local_e0;
          pdVar9 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pMVar5 = (this->contactPositions_).
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar19 = *(double *)
                    ((long)(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data.array + lVar11 + -0x10);
          dVar22 = *(double *)
                    ((long)(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data.array + lVar11 + -8);
          dVar17 = *(double *)
                    ((long)(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data.array + lVar11);
          dVar23 = dVar17 * ((double)local_68 * (double)local_a8._8_8_ + dVar21 * local_e0) +
                   dVar22 * ((double)local_a8._8_8_ * dVar21 - (double)local_68 * local_e0) +
                   dVar19 * ((double)local_a8._0_8_ * dVar21 + dVar16);
          dVar24 = dVar17 * (dVar25 - (double)local_68 * (double)local_a8._0_8_) +
                   dVar22 * ((double)local_a8._8_8_ * dVar20 * (double)local_a8._8_8_ + dVar16) +
                   dVar19 * ((double)local_68 * local_e0 + (double)local_a8._8_8_ * dVar21);
          dVar17 = (local_e0 * dVar20 * local_e0 + dVar16) * dVar17 +
                   ((double)local_68 * (double)local_a8._0_8_ + dVar25) * dVar22 +
                   (dVar21 * local_e0 - (double)local_68 * (double)local_a8._8_8_) * dVar19;
          dVar16 = pdVar9[9];
          dVar19 = pdVar9[10];
          dVar22 = pdVar9[0xb];
          pdVar9[6] = pdVar9[6] + dVar22 * dVar24 + dVar19 * -dVar17 + dVar16 * 0.0;
          pdVar9[7] = pdVar9[7] + dVar22 * -dVar23 + dVar19 * 0.0 + dVar16 * dVar17;
          pdVar9[8] = ((dVar22 * 0.0 + dVar23 * dVar19) - dVar24 * dVar16) + pdVar9[8];
          uVar12 = uVar12 + 1;
          uVar13 = (ulong)(this->functor_).nbContacts_;
          lVar11 = lVar11 + 0x18;
        } while (uVar12 < uVar13);
      }
      if (8 < (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) {
        pdVar9 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data;
        dVar16 = (double)uVar13;
        auVar7._8_8_ = dVar16;
        auVar7._0_8_ = dVar16;
        auVar18 = divpd(*(undefined1 (*) [16])(pdVar9 + 6),auVar7);
        *(undefined1 (*) [16])(pdVar9 + 6) = auVar18;
        pdVar9[8] = pdVar9[8] / dVar16;
LAB_0014a876:
        (this->functor_).printed_ = false;
        return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
      }
    }
LAB_0014a899:
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    clock_gettime(2,&local_78);
    clock_gettime(2,(timespec *)(auStack_90 + 8));
    uVar8 = ZeroDelayObserver::getMeasurementTime((ZeroDelayObserver *)pEVar1);
    (this->super_EKFFlexibilityEstimatorBase).k_ = uVar8;
    uVar8 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)pEVar1);
    uVar8 = uVar8 + 1;
    if (uVar8 <= (this->super_EKFFlexibilityEstimatorBase).k_) {
      this_00 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                 *)&this->contactPositions_;
      local_a8._0_8_ = &this->functor_;
      this_01 = &this->functor_;
      local_98 = this_00;
      do {
        if ((this->super_EKFFlexibilityEstimatorBase).finiteDifferencesJacobians_ == true) {
          KalmanFilterBase::updatePredictedMeasurement(&pEVar1->super_KalmanFilterBase);
          IMUElasticLocalFrameDynamicalSystem::stateDynamicsJacobian((Matrix *)local_c8,this_01);
          KalmanFilterBase::setA(&pEVar1->super_KalmanFilterBase,(Matrix *)local_c8);
          free((void *)local_c8._0_8_);
          IMUElasticLocalFrameDynamicalSystem::measureDynamicsJacobian((Matrix *)local_c8,this_01);
          KalmanFilterBase::setC(&pEVar1->super_KalmanFilterBase,(Matrix *)local_c8);
          free((void *)local_c8._0_8_);
          this_00 = local_98;
        }
        pMVar5 = (this->contactPositions_).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->contactPositions_).
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
          (this->contactPositions_).
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
        }
        if ((this->functor_).nbContacts_ != 0) {
          uVar14 = 0x2a;
          uVar13 = 0;
          do {
            (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0xe])(&local_d8,this);
            uVar12 = (ulong)uVar14;
            if (local_d0 + -3 < (long)uVar12) goto LAB_0014a899;
            pdVar9 = (double *)((long)local_d8 + uVar12 * 8);
            local_c8._0_8_ = *pdVar9;
            local_c8._8_8_ = pdVar9[1];
            local_b8 = *(double *)((long)local_d8 + uVar12 * 8 + 0x10);
            __position._M_current =
                 (this->contactPositions_).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->contactPositions_).
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                        (this_00,__position,(Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
            }
            else {
              ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              ).m_storage.m_data.array[2] = local_b8;
              ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              ).m_storage.m_data.array[0] = (double)local_c8._0_8_;
              ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              ).m_storage.m_data.array[1] = (double)local_c8._8_8_;
              ppMVar2 = &(this->contactPositions_).
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppMVar2 = *ppMVar2 + 1;
            }
            free(local_d8);
            uVar13 = uVar13 + 1;
            uVar14 = uVar14 + 0xc;
          } while (uVar13 < (this->functor_).nbContacts_);
        }
        ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_50,(uint)pEVar1);
        free((void *)local_50._0_8_);
        uVar8 = uVar8 + 1;
        this_01 = (IMUElasticLocalFrameDynamicalSystem *)local_a8._0_8_;
      } while (uVar8 <= (this->super_EKFFlexibilityEstimatorBase).k_);
    }
    ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_c8,(uint)pEVar1);
    __ptr = (_func_int **)
            (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
    (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_c8._0_8_;
    dVar16 = (double)(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
    (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_c8._8_8_;
    local_c8._0_8_ = __ptr;
    local_c8._8_8_ = dVar16;
    free(__ptr);
    pdVar9 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar13 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (0 < (long)uVar13) {
      lVar11 = 0;
      do {
        pdVar6 = pdVar9 + lVar11;
        if (NAN(*pdVar6)) break;
        bVar15 = uVar13 - 1 != lVar11;
        lVar11 = lVar11 + 1;
      } while (bVar15);
      if (NAN(*pdVar6)) {
        ZeroDelayObserver::setState
                  ((ZeroDelayObserver *)pEVar1,&(this->super_EKFFlexibilityEstimatorBase).lastX_,
                   (this->super_EKFFlexibilityEstimatorBase).k_);
        if (1 < (this->super_EKFFlexibilityEstimatorBase).k_) {
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x17])(this);
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x3e])(this);
        }
        goto LAB_0014a483;
      }
    }
    pVVar3 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar13) {
      if ((long)uVar13 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)pVVar3,uVar13,uVar13,1);
    }
    uVar12 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (uVar12 != uVar13) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar6 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar13 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar12) {
      lVar11 = 0;
      do {
        dVar16 = (pdVar9 + lVar11)[1];
        pdVar4 = pdVar6 + lVar11;
        *pdVar4 = pdVar9[lVar11];
        pdVar4[1] = dVar16;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar12) {
      do {
        pdVar6[uVar13] = pdVar9[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if (5 < (this->super_EKFFlexibilityEstimatorBase).lastX_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar9 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_c8._0_8_ = pdVar9[3];
      local_c8._8_8_ = pdVar9[4];
      local_b8 = pdVar9[5];
      kine::regulateOrientationVector((kine *)&local_d8,(Vector3 *)local_c8);
      if (5 < (this->super_EKFFlexibilityEstimatorBase).lastX_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        if (local_d0 != 3) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                       );
        }
        pdVar9 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3
        ;
        uVar13 = 3;
        if (((ulong)pdVar9 & 7) == 0) {
          uVar13 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
        }
        uVar8 = (uint)uVar13 ^ 3;
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            pdVar9[uVar12] = *(double *)((long)local_d8 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
        uVar12 = (uVar8 & 0xfffffffe) + uVar13;
        if (1 < uVar8) {
          do {
            pdVar6 = (double *)((long)local_d8 + uVar13 * 8);
            dVar16 = pdVar6[1];
            pdVar9[uVar13] = *pdVar6;
            (pdVar9 + uVar13)[1] = dVar16;
            uVar13 = uVar13 + 2;
          } while (uVar13 < uVar12);
        }
        if ((uint)uVar12 < 3) {
          do {
            pdVar9[uVar12] = *(double *)((long)local_d8 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar12 != 3);
        }
        free(local_d8);
        if (this->limitOn_ == true) {
          lVar11 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          lVar10 = 0x12;
          if (0x12 < lVar11) {
            lVar10 = lVar11;
          }
          pdVar9 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          lVar11 = 0;
          do {
            if (lVar10 + -0x12 == lVar11) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            dVar16 = (this->limitTorques_).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[lVar11];
            if (pdVar9[lVar11 + 0x12] <= dVar16) {
              dVar16 = pdVar9[lVar11 + 0x12];
            }
            pdVar9[lVar11 + 0x12] = dVar16;
            dVar19 = (this->limitForces_).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[lVar11];
            if (pdVar9[lVar11 + 0xc] <= dVar19) {
              dVar19 = pdVar9[lVar11 + 0xc];
            }
            pdVar9[lVar11 + 0xc] = dVar19;
            dVar22 = -(this->limitTorques_).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[lVar11];
            if (dVar22 <= dVar16) {
              dVar22 = dVar16;
            }
            pdVar9[lVar11 + 0x12] = dVar22;
            dVar16 = -(this->limitForces_).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[lVar11];
            if (dVar16 <= dVar19) {
              dVar16 = dVar19;
            }
            pdVar9[lVar11 + 0xc] = dVar16;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
        }
        uVar8 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)pEVar1);
        ZeroDelayObserver::setState((ZeroDelayObserver *)pEVar1,pVVar3,uVar8);
        goto LAB_0014a483;
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

const Vector & ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector()
    {
      timespec time1, time2, time3;

      if(on_==true)
      {
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
        if (ekf_.getMeasurementsNumber()>0)
        {
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
          k_=ekf_.getMeasurementTime();

          unsigned i;
          for (i=ekf_.getCurrentTime()+1; i<=k_; ++i)
          {
            if (finiteDifferencesJacobians_)
            {
              ekf_.updatePredictedMeasurement();///triggers also ekf_.updatePrediction();

              //ekf_.setA(ekf_.getAMatrixFD(dx_));
              //ekf_.setC(ekf_.getCMatrixFD(dx_));
              ekf_.setA(functor_.stateDynamicsJacobian());
              ekf_.setC(functor_.measureDynamicsJacobian());
            }

            ///regulate the part of orientation vector in the state vector
            ///temporary code
            contactPositions_.clear();
            for (unsigned i = 0; i<functor_.getContactsNumber() ; ++i)
            {
              contactPositions_.push_back(getInput().segment<3>(42 + 12*i));
            }
            ekf_.getEstimatedState(i);
          }
          x_=ekf_.getEstimatedState(k_);
#ifndef EIGEN_VERSION_LESS_THAN_3_2
          if (! x_.hasNaN())//detect NaN values
          {
#else
          if (x_==x_)//detect NaN values
          {
#endif // EIGEN_VERSION_LESS_THAN_3_2
            lastX_=x_;

            ///regulate the part of orientation vector in the state vector
            lastX_.segment(state::ori,3)=kine::regulateOrientationVector(lastX_.segment(state::ori,3));
            if(limitOn_)
            {
              for(int i=0; i<3; i++)
              {
                // Saturation for bounded forces and torques
                lastX_[state::fc+6+i]=std::min(lastX_[state::fc+6+i],limitTorques_[i]);
                lastX_[state::fc+i]=std::min(lastX_[state::fc+i],limitForces_[i]);
                lastX_[state::fc+6+i]=std::max(lastX_[state::fc+6+i],-limitTorques_[i]);
                lastX_[state::fc+i]=std::max(lastX_[state::fc+i],-limitForces_[i]);
              }
            }
            ekf_.setState(lastX_,ekf_.getCurrentTime());
          }
          else //delete NaN values
          {
            ekf_.setState(lastX_,k_);

            if(k_>1) //the first iteration give always nan when not
              //initialized
            {
              resetCovarianceMatrices();
              resetStateCovarianceMatrix();
            }
          }
        }
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time3);

        computeFlexibilityTime_=(double)diff(time2,time3).tv_nsec-(double)diff(time1,time2).tv_nsec;

        // To be deleted: constrain the internal linear velocity of the flexibility of each foot to zero.
        x_.segment<3>(state::linVel).setZero();
        for(int i=0; i<functor_.getContactsNumber();++i)
        {
          x_.segment<3>(state::linVel) += kine::skewSymmetric(kine::rotationVectorToRotationMatrix(x_.segment<3>(state::ori))*contactPositions_[i])*x_.segment<3>(state::angVel);
        }
        x_.segment<3>(state::linVel)=x_.segment<3>(state::linVel)/functor_.getContactsNumber();
      }
      else
      {
        lastX_.setZero();
        ekf_.setState(lastX_,ekf_.getCurrentTime());

        if (ekf_.getMeasurementsNumber()>0)
        {
          ekf_.clearMeasurements();
          ekf_.clearInputs();
          resetStateCovarianceMatrix();
        }
      }

      functor_.setPrinted(false);
      return lastX_;
    }

    stateObservation::Matrix& ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix()
    {
        op_.O.resize(getMeasurementSize()*2,getStateSize());
        op_.CA.resize(getMeasurementSize(),getStateSize());
        op_.CA  = ekf_.getC();
        op_.O.block(0,0,getMeasurementSize(),getStateSize()) = op_.CA;
        op_.CA = op_.CA * ekf_.getA();
        op_.O.block(getMeasurementSize(),0,getMeasurementSize(),getStateSize()) = op_.CA;
        return op_.O;
    }

    void ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(double dt)
    {
        dt_=dt;
        functor_.setSamplingPeriod(dt);
    }

    /// Enable or disable the estimation
    void ModelBaseEKFFlexEstimatorIMU::setOn(bool & b)
    {
        on_=b;
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfe(const Matrix3 & m)
    {
        functor_.setKfe(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfv(const Matrix3 & m)
    {
        functor_.setKfv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKte(const Matrix3 & m)
    {
        functor_.setKte(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtv(const Matrix3 & m)
    {
        functor_.setKtv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfeRopes(const Matrix3 & m)
    {
        functor_.setKfeRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfvRopes(const Matrix3 & m)
    {
        functor_.setKfvRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKteRopes(const Matrix3 & m)
    {
        functor_.setKteRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtvRopes(const Matrix3 & m)
    {
        functor_.setKtvRopes(m);
	}

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfe() const
    {
        return functor_.getKfe();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfv() const
    {
        return functor_.getKfv();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKte() const
    {
        return functor_.getKte();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKtv() const
    {
        return functor_.getKtv();
    }

    double& ModelBaseEKFFlexEstimatorIMU::getComputeFlexibilityTime()
    {
        return computeFlexibilityTime_;
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements(bool b)
    {
      if (useFTSensors_!= b)
      {
        useFTSensors_=b;
        functor_.setWithForceMeasurements(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());

        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithAbsolutePos(bool b)
    {
      if (withAbsolutePos_!= b)
      {
        functor_.setWithAbsolutePosition(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        withAbsolutePos_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces(bool b)
    {
      if (withUnmodeledForces_!= b)
      {
        functor_.setWithUnmodeledForces(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setInputSize(functor_.getInputSize());
        withUnmodeledForces_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    bool ModelBaseEKFFlexEstimatorIMU::getWithForcesMeasurements()
    {
        return useFTSensors_;
    }


    void ModelBaseEKFFlexEstimatorIMU::setWithComBias(bool b)
    {
      if (withComBias_!= b)
      {
        withComBias_=b;
        functor_.setWithComBias(b);
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
    {
        unmodeledForceVariance_ = d;
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
        P_=ekf_.getStateCovariance();
        P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
        ekf_.setStateCovariance(P_);
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceProcessVariance(double d)
    {
        Q_.diagonal().segment<6>(state::unmodeledForces).setConstant(d);
        ekf_.setQ(Q_);
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
    }

    void ModelBaseEKFFlexEstimatorIMU::setForceVariance(double d)
    {
        forceVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setAbsolutePosVariance(double d)
    {
        absPosVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setRobotMass(double m)
    {
        functor_.setRobotMass(m);
    }

}